

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_syntax.hpp
# Opt level: O0

size_t __thiscall
jessilib::fail_action<char16_t,jessilib::json_context<char16_t,true>,true>
          (jessilib *this,decode_result param_1,json_context<char16_t,_true> *param_2,
          basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_read_view)

{
  invalid_argument *this_00;
  decode_result dVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_98 [2];
  size_t local_78;
  char16_t *pcStack_70;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_68;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_58;
  string local_48;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *local_28;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_read_view_local;
  json_context<char16_t,_true> *param_1_local;
  decode_result param_0_local;
  
  in_read_view_local = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)param_1.units;
  param_0_local._0_8_ = param_1._0_8_;
  param_1_local._0_4_ = SUB84(this,0);
  local_28 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)param_2;
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_58 = sv("Invalid parse data; unexpected token: \'",0x27);
  local_78 = local_28->_M_len;
  pcStack_70 = local_28->_M_str;
  dVar1 = decode_codepoint<char16_t>(*local_28);
  local_68._M_str = (char8_t *)dVar1.units;
  local_68._M_len._0_4_ = dVar1.codepoint;
  local_98[0] = sv("\' when parsing data",0x13);
  join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (&local_48,(jessilib *)&local_58,&local_68,(char32_t *)local_98,
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)in_read_view);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t fail_action(decode_result, ContextT&, std::basic_string_view<CharT>& in_read_view) {
	using namespace std::literals;
	if constexpr (UseExceptionsV) {
		throw std::invalid_argument{ jessilib::join_mbstring(u8"Invalid parse data; unexpected token: '"sv,
			jessilib::decode_codepoint(in_read_view).codepoint,
			u8"' when parsing data"sv) };
	}
	return std::numeric_limits<size_t>::max();
}